

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  ArenaStringPtr *pAVar1;
  byte *pbVar2;
  int32 iVar3;
  int iVar4;
  string *psVar5;
  once_flag *__once;
  long lVar6;
  uint uVar7;
  long lVar8;
  FieldOptions *pFVar9;
  FieldOptions *pFVar10;
  uint uVar11;
  Arena *pAVar12;
  string *psVar13;
  FieldDescriptor *pFVar14;
  undefined1 local_48 [32];
  FieldDescriptor *local_28;
  
  psVar13 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar12 = (Arena *)(proto->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
  if (((ulong)pAVar12 & 1) != 0) {
    pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
  }
  psVar5 = (proto->name_).ptr_;
  if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar12,psVar13);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar5);
  }
  iVar3 = *(int32 *)(this + 0x44);
  uVar7 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar7 | 0x40;
  proto->number_ = iVar3;
  if (this[0x41] == (FieldDescriptor)0x1) {
    psVar13 = *(string **)(this + 0x20);
    (proto->_has_bits_).has_bits_[0] = uVar7 | 0x50;
    pAVar12 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
    }
    psVar5 = (proto->json_name_).ptr_;
    if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&proto->json_name_,pAVar12,psVar13);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar5);
    }
  }
  iVar4 = *(int *)(this + 0x3c);
  uVar7 = (proto->_has_bits_).has_bits_[0] | 0x100;
  (proto->_has_bits_).has_bits_[0] = uVar7;
  proto->label_ = iVar4;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_48._0_8_ = TypeOnceInit;
    local_28 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_48,&local_28);
    uVar7 = (proto->_has_bits_).has_bits_[0];
  }
  iVar4 = *(int *)(this + 0x38);
  uVar11 = uVar7 | 0x200;
  (proto->_has_bits_).has_bits_[0] = uVar11;
  proto->type_ = iVar4;
  if (this[0x42] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x50) + 0x89) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar7 | 0x202;
      local_48._0_8_ = (FieldDescriptor *)(local_48 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,".","");
      pAVar12 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
      }
      psVar13 = (proto->extendee_).ptr_;
      if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&proto->extendee_,pAVar12,(string *)local_48);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar13);
      }
      if ((FieldDescriptor *)local_48._0_8_ != (FieldDescriptor *)(local_48 + 0x10)) {
        operator_delete((void *)local_48._0_8_);
      }
      uVar11 = (proto->_has_bits_).has_bits_[0];
    }
    (proto->_has_bits_).has_bits_[0] = uVar11 | 2;
    pAVar1 = &proto->extendee_;
    pAVar12 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
    }
    psVar13 = pAVar1->ptr_;
    if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = pAVar1->ptr_;
    }
    std::__cxx11::string::_M_append((char *)psVar13,**(ulong **)(*(long *)(this + 0x50) + 8));
  }
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_48._0_8_ = TypeOnceInit;
    local_28 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_48,&local_28);
  }
  uVar7 = *(uint *)(this + 0x38);
  __once = *(once_flag **)(this + 0x30);
  if ((uVar7 & 0xfffffffe) == 10) {
    if (__once != (once_flag *)0x0) {
      local_48._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,TypeOnceInit,(FieldDescriptor **)local_48);
    }
    lVar8 = *(long *)(this + 0x68);
    if (*(char *)(lVar8 + 0x88) == '\x01') {
      proto->type_ = 1;
      pbVar2 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 & 0xfd;
    }
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_48._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_48);
      lVar8 = *(long *)(this + 0x68);
    }
    uVar7 = (proto->_has_bits_).has_bits_[0];
    if (*(char *)(lVar8 + 0x89) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar7 | 4;
      local_48._0_8_ = (FieldDescriptor *)(local_48 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,".","");
      pAVar12 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
      }
      psVar13 = (proto->type_name_).ptr_;
      if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&proto->type_name_,pAVar12,(string *)local_48);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar13);
      }
      if ((FieldDescriptor *)local_48._0_8_ != (FieldDescriptor *)(local_48 + 0x10)) {
        operator_delete((void *)local_48._0_8_);
      }
      uVar7 = (proto->_has_bits_).has_bits_[0];
    }
    (proto->_has_bits_).has_bits_[0] = uVar7 | 4;
    pAVar1 = &proto->type_name_;
    pAVar12 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
    }
    psVar13 = pAVar1->ptr_;
    if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = pAVar1->ptr_;
    }
    pFVar14 = this + 0x68;
  }
  else {
    if (__once != (once_flag *)0x0) {
      local_48._0_8_ = TypeOnceInit;
      local_28 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)local_48,&local_28);
      uVar7 = *(uint *)(this + 0x38);
    }
    if (uVar7 != 0xe) goto LAB_002c8f7f;
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_48._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_48);
    }
    uVar7 = (proto->_has_bits_).has_bits_[0];
    if (*(char *)(*(long *)(this + 0x70) + 0x29) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar7 | 4;
      local_48._0_8_ = (FieldDescriptor *)(local_48 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,".","");
      pAVar12 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
      }
      psVar13 = (proto->type_name_).ptr_;
      if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&proto->type_name_,pAVar12,(string *)local_48);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar13);
      }
      if ((FieldDescriptor *)local_48._0_8_ != (FieldDescriptor *)(local_48 + 0x10)) {
        operator_delete((void *)local_48._0_8_);
      }
      uVar7 = (proto->_has_bits_).has_bits_[0];
    }
    (proto->_has_bits_).has_bits_[0] = uVar7 | 4;
    pAVar1 = &proto->type_name_;
    pAVar12 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
    }
    psVar13 = pAVar1->ptr_;
    if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar13 = pAVar1->ptr_;
    }
    pFVar14 = this + 0x70;
  }
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_48._0_8_ = this;
    std::
    call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_48);
  }
  std::__cxx11::string::_M_append((char *)psVar13,**(ulong **)(*(long *)pFVar14 + 8));
LAB_002c8f7f:
  if (this[0x40] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_((string *)local_48,this,false);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    pAVar12 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar12 & 1) != 0) {
      pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
    }
    psVar13 = (proto->default_value_).ptr_;
    if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&proto->default_value_,pAVar12,(string *)local_48);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar13);
    }
    if ((FieldDescriptor *)local_48._0_8_ != (FieldDescriptor *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  lVar8 = *(long *)(this + 0x58);
  if ((lVar8 != 0) && (this[0x42] == (FieldDescriptor)0x0)) {
    lVar6 = *(long *)(*(long *)(lVar8 + 0x10) + 0x30);
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x80;
    proto->oneof_index_ = (int)((ulong)(lVar8 - lVar6) >> 4) * -0x55555555;
  }
  pFVar10 = *(FieldOptions **)(this + 0x78);
  pFVar9 = FieldOptions::default_instance();
  if (pFVar10 != pFVar9) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    pFVar10 = proto->options_;
    if (pFVar10 == (FieldOptions *)0x0) {
      pAVar12 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18);
      }
      pFVar10 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar12);
      proto->options_ = pFVar10;
    }
    FieldOptions::CopyFrom(pFVar10,*(FieldOptions **)(this + 0x78));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
      implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
      implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}